

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

void __thiscall OpenMD::Thermo::getComAll(Thermo *this,Vector3d *com,Vector3d *comVel)

{
  Molecule *this_00;
  int extraout_EDX;
  int __denom;
  int extraout_EDX_00;
  int __denom_00;
  int __numer;
  MoleculeIterator *i_00;
  Snapshot *this_01;
  RealType s;
  MoleculeIterator i;
  MoleculeIterator local_70;
  Snapshot *local_68;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  this_01 = this->info_->sman_->currentSnapshot_;
  if ((this_01->hasCOM != true) || (this_01->hasCOMvel == false)) {
    local_70._M_node = (_Base_ptr)0x0;
    local_48.data_[0] = 0.0;
    local_68 = this_01;
    Vector<double,_3U>::Vector(&local_60,local_48.data_);
    Vector3<double>::operator=(com,&local_60);
    local_48.data_[0] = 0.0;
    Vector<double,_3U>::Vector(&local_60,local_48.data_);
    Vector3<double>::operator=(comVel,&local_60);
    i_00 = &local_70;
    this_00 = SimInfo::beginMolecule(this->info_,i_00);
    __denom = extraout_EDX;
    while (__numer = (int)i_00, this_00 != (Molecule *)0x0) {
      s = Molecule::getMass(this_00);
      Molecule::getCom((Vector3d *)&local_48,this_00);
      operator*(&local_60,s,&local_48);
      Vector<double,_3U>::add(&com->super_Vector<double,_3U>,&local_60);
      Molecule::getComVel((Vector3d *)&local_48,this_00);
      operator*(&local_60,s,&local_48);
      Vector<double,_3U>::add(&comVel->super_Vector<double,_3U>,&local_60);
      i_00 = &local_70;
      this_00 = SimInfo::nextMolecule(this->info_,i_00);
      __denom = extraout_EDX_00;
    }
    Vector<double,_3U>::div(&com->super_Vector<double,_3U>,__numer,__denom);
    Vector<double,_3U>::div(&comVel->super_Vector<double,_3U>,__numer,__denom_00);
    this_01 = local_68;
    Snapshot::setCOM(local_68,com);
    Snapshot::setCOMvel(this_01,comVel);
  }
  Snapshot::getCOM((Vector3d *)&local_60,this_01);
  Vector<double,_3U>::operator=(&com->super_Vector<double,_3U>,&local_60);
  Snapshot::getCOMvel((Vector3d *)&local_60,this_01);
  Vector<double,_3U>::operator=(&comVel->super_Vector<double,_3U>,&local_60);
  return;
}

Assistant:

void Thermo::getComAll(Vector3d& com, Vector3d& comVel) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!(snap->hasCOM && snap->hasCOMvel)) {
      SimInfo::MoleculeIterator i;
      Molecule* mol;

      RealType totalMass(0.0);

      com    = 0.0;
      comVel = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        RealType mass = mol->getMass();
        totalMass += mass;
        com += mass * mol->getCom();
        comVel += mass * mol->getComVel();
      }

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, &totalMass, 1, MPI_REALTYPE, MPI_SUM,
                    MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, com.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, comVel.getArrayPointer(), 3, MPI_REALTYPE,
                    MPI_SUM, MPI_COMM_WORLD);
#endif

      com /= totalMass;
      comVel /= totalMass;
      snap->setCOM(com);
      snap->setCOMvel(comVel);
    }
    com    = snap->getCOM();
    comVel = snap->getCOMvel();
    return;
  }